

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_standard(cm_printf_type type,char *test_name,char *error_message)

{
  long in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  
  switch(in_EDI) {
  case 0:
    print_message("[ RUN      ] %s\n",in_RSI);
    break;
  case 1:
    print_message("[       OK ] %s\n",in_RSI);
    break;
  case 2:
    if (in_RDX != 0) {
      print_error("[  ERROR   ] --- %s\n",in_RDX);
    }
    print_message("[  FAILED  ] %s\n",in_RSI);
    break;
  case 3:
    if (in_RDX != 0) {
      print_error("%s\n",in_RDX);
    }
    print_error("[  ERROR   ] %s\n",in_RSI);
    break;
  case 4:
    print_message("[  SKIPPED ] %s\n",in_RSI);
  }
  return;
}

Assistant:

static void cmprintf_standard(enum cm_printf_type type,
                              const char *test_name,
                              const char *error_message)
{
    switch (type) {
    case PRINTF_TEST_START:
        print_message("[ RUN      ] %s\n", test_name);
        break;
    case PRINTF_TEST_SUCCESS:
        print_message("[       OK ] %s\n", test_name);
        break;
    case PRINTF_TEST_FAILURE:
        if (error_message != NULL) {
            print_error("[  ERROR   ] --- %s\n", error_message);
        }
        print_message("[  FAILED  ] %s\n", test_name);
        break;
    case PRINTF_TEST_SKIPPED:
        print_message("[  SKIPPED ] %s\n", test_name);
        break;
    case PRINTF_TEST_ERROR:
        if (error_message != NULL) {
            print_error("%s\n", error_message);
        }
        print_error("[  ERROR   ] %s\n", test_name);
        break;
    }
}